

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void plot_masked_sprite_24px(tgestate_t *state,vischar_t *vischar)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  byte *pbVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  ushort uVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  byte *pbVar11;
  byte bVar12;
  byte bVar13;
  ushort uVar14;
  byte bVar15;
  uint8_t uVar16;
  ulong uVar17;
  byte bVar18;
  long lVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  
  uVar14 = (vischar->isopos).x;
  uVar7 = uVar14 & 7;
  if (uVar7 < 4) {
    uVar14 = uVar14 & 3;
    puVar1 = state->bitmap_pointer;
    puVar2 = state->mask_pointer;
    uVar16 = (state->spriteplotter).height_24_right;
    lVar19 = 0;
    do {
      bVar10 = puVar1[lVar19];
      bVar13 = puVar1[lVar19 + 1];
      bVar23 = puVar1[lVar19 + 2];
      bVar9 = puVar2[lVar19];
      bVar20 = puVar2[lVar19 + 1];
      bVar15 = puVar2[lVar19 + 2];
      if ((char)state->sprite_index < '\0') {
        uVar8 = (ulong)bVar10;
        uVar17 = (ulong)bVar9;
        bVar9 = state->reversed[bVar15];
        bVar15 = state->reversed[uVar17];
        bVar20 = state->reversed[bVar20];
        bVar10 = state->reversed[bVar23];
        bVar23 = state->reversed[uVar8];
        bVar13 = state->reversed[bVar13];
      }
      if (uVar14 == 3) {
        bVar21 = bVar10 << 7;
        bVar12 = bVar13 << 7;
        bVar24 = bVar23 << 7;
        bVar10 = bVar10 >> 1;
        bVar13 = bVar21 | bVar13 >> 1;
        bVar23 = bVar12 | bVar23 >> 1;
LAB_001093fd:
        bVar22 = bVar10 << 7;
        bVar21 = bVar13 << 7;
        bVar12 = bVar23 << 7 | bVar24 >> 1;
        bVar5 = true;
        bVar10 = bVar10 >> 1;
        bVar13 = bVar22 | bVar13 >> 1;
        bVar23 = bVar21 | bVar23 >> 1;
      }
      else {
        bVar5 = false;
        bVar24 = 0;
        bVar12 = 0;
        if ((uVar14 ^ 2) < 2) goto LAB_001093fd;
      }
      bVar24 = 0xff;
      if (uVar14 != 0) {
        bVar21 = bVar10 >> 1;
        bVar18 = bVar10 << 7 | bVar13 >> 1;
        bVar22 = bVar13 << 7 | bVar23 >> 1;
        bVar12 = bVar23 << 7 | bVar12 >> 1;
        bVar10 = bVar21;
        bVar13 = bVar18;
        bVar23 = bVar22;
        if (uVar14 == 3) {
          bVar21 = bVar9 << 7;
          bVar22 = bVar20 << 7;
          bVar24 = bVar15 << 7 | 0x7f;
          bVar9 = bVar9 >> 1 | 0x80;
          bVar20 = bVar21 | bVar20 >> 1;
          bVar15 = bVar22 | bVar15 >> 1;
        }
      }
      bVar21 = bVar9;
      bVar22 = bVar20;
      bVar18 = bVar15;
      if (bVar5) {
        bVar21 = bVar9 >> 1 | 0x80;
        bVar22 = bVar9 << 7 | bVar20 >> 1;
        bVar18 = bVar20 << 7 | bVar15 >> 1;
        bVar24 = bVar24 >> 1 | bVar15 << 7;
      }
      bVar9 = bVar21;
      bVar15 = bVar22;
      bVar20 = bVar18;
      if (uVar14 != 0) {
        bVar9 = bVar21 >> 1 | 0x80;
        bVar15 = bVar21 << 7 | bVar22 >> 1;
        bVar20 = bVar22 << 7 | bVar18 >> 1;
        bVar24 = bVar24 >> 1 | bVar18 << 7;
      }
      pbVar11 = state->window_buf_pointer;
      pbVar3 = state->foreground_mask_pointer;
      if ((state->spriteplotter).enable_24_right_1 != '\0') {
        *pbVar11 = bVar10 & *pbVar3 | (bVar9 | ~*pbVar3) & *pbVar11;
      }
      if ((state->spriteplotter).enable_24_right_2 != '\0') {
        pbVar11[1] = bVar13 & pbVar3[1] | (bVar15 | ~pbVar3[1]) & pbVar11[1];
      }
      if ((state->spriteplotter).enable_24_right_3 != '\0') {
        pbVar11[2] = bVar23 & pbVar3[2] | (bVar20 | ~pbVar3[2]) & pbVar11[2];
      }
      pbVar11 = pbVar11 + 3;
      if ((state->spriteplotter).enable_24_right_4 != '\0') {
        *pbVar11 = bVar12 & pbVar3[3] | (bVar24 | ~pbVar3[3]) & *pbVar11;
      }
      state->foreground_mask_pointer = pbVar3 + 4;
      state->window_buf_pointer = pbVar11 + (long)state->columns + -3;
      lVar19 = lVar19 + 3;
      uVar16 = uVar16 + 0xff;
    } while (uVar16 != '\0');
  }
  else {
    puVar1 = state->bitmap_pointer;
    puVar2 = state->mask_pointer;
    uVar16 = (state->spriteplotter).height_24_left;
    uVar14 = uVar7 + 0xfc & 0xff;
    lVar19 = 0;
    do {
      bVar15 = puVar1[lVar19];
      bVar20 = puVar1[lVar19 + 1];
      bVar9 = puVar1[lVar19 + 2];
      bVar23 = puVar2[lVar19];
      bVar10 = puVar2[lVar19 + 1];
      bVar13 = puVar2[lVar19 + 2];
      if ((char)state->sprite_index < '\0') {
        uVar8 = (ulong)bVar15;
        uVar17 = (ulong)bVar23;
        bVar23 = state->reversed[bVar13];
        bVar13 = state->reversed[uVar17];
        bVar10 = state->reversed[bVar10];
        bVar15 = state->reversed[bVar9];
        bVar9 = state->reversed[uVar8];
        bVar20 = state->reversed[bVar20];
      }
      if (uVar14 == 0) {
        bVar24 = bVar9 * '\x02';
        bVar12 = bVar20 * '\x02' | bVar9 >> 7;
        bVar21 = bVar15 >> 7;
        bVar15 = bVar15 * '\x02' | bVar20 >> 7;
LAB_001096d6:
        bVar9 = bVar24 * '\x02';
        bVar20 = bVar12 * '\x02' | bVar24 >> 7;
        bVar24 = bVar15 * '\x02' | bVar12 >> 7;
        bVar21 = bVar21 * '\x02' | bVar15 >> 7;
        bVar5 = true;
LAB_00109705:
        bVar4 = bVar5;
        bVar15 = bVar24 * '\x02' | bVar20 >> 7;
        bVar12 = bVar21 * '\x02' | bVar24 >> 7;
        bVar21 = 1;
        bVar20 = bVar20 * '\x02' | bVar9 >> 7;
        bVar9 = bVar9 * '\x02';
      }
      else {
        bVar21 = 0;
        bVar12 = bVar20;
        bVar24 = bVar9;
        if (uVar14 == 1) goto LAB_001096d6;
        bVar4 = false;
        bVar12 = 0;
        bVar24 = bVar15;
        bVar5 = false;
        if (uVar14 < 3) goto LAB_00109705;
      }
      bVar18 = 0xff;
      bVar24 = bVar10;
      bVar22 = bVar13;
      if (uVar14 == 0) {
        bVar22 = bVar13 * '\x02' + 1;
        bVar24 = bVar10 * '\x02' | bVar13 >> 7;
        bVar18 = bVar23 >> 7;
        bVar23 = bVar23 * '\x02' | bVar10 >> 7;
        bVar18 = bVar18 | 0xfe;
      }
      bVar13 = bVar23;
      bVar10 = bVar24;
      bVar6 = bVar22;
      if (bVar4) {
        bVar6 = bVar22 * '\x02' + 1;
        bVar10 = bVar24 * '\x02' | bVar22 >> 7;
        bVar13 = bVar23 * '\x02' | bVar24 >> 7;
        bVar18 = bVar18 * '\x02' | bVar23 >> 7;
      }
      bVar23 = bVar13;
      bVar24 = bVar10;
      bVar22 = bVar6;
      if (bVar21 != 0) {
        bVar22 = bVar6 * '\x02' + 1;
        bVar24 = bVar10 * '\x02' | bVar6 >> 7;
        bVar23 = bVar13 * '\x02' | bVar10 >> 7;
        bVar18 = bVar18 * '\x02' | bVar13 >> 7;
      }
      pbVar11 = state->window_buf_pointer;
      pbVar3 = state->foreground_mask_pointer;
      if ((state->spriteplotter).enable_24_left_1 != '\0') {
        *pbVar11 = (bVar12 * '\x02' | bVar15 >> 7) & *pbVar3 |
                   (~*pbVar3 | bVar18 * '\x02' | bVar23 >> 7) & *pbVar11;
      }
      if ((state->spriteplotter).enable_24_left_2 != '\0') {
        pbVar11[1] = (bVar15 * '\x02' | bVar20 >> 7) & pbVar3[1] |
                     (~pbVar3[1] | bVar23 * '\x02' | bVar24 >> 7) & pbVar11[1];
      }
      if ((state->spriteplotter).enable_24_left_3 != '\0') {
        pbVar11[2] = (bVar20 * '\x02' | bVar9 >> 7) & pbVar3[2] |
                     (~pbVar3[2] | bVar24 * '\x02' | bVar22 >> 7) & pbVar11[2];
      }
      pbVar11 = pbVar11 + 3;
      if ((state->spriteplotter).enable_24_left_4 != '\0') {
        *pbVar11 = bVar9 * '\x02' & pbVar3[3] | (~pbVar3[3] | bVar22 * '\x02' | 1) & *pbVar11;
      }
      state->foreground_mask_pointer = pbVar3 + 4;
      state->window_buf_pointer = pbVar11 + (long)state->columns + -3;
      lVar19 = lVar19 + 3;
      uVar16 = uVar16 + 0xff;
    } while (uVar16 != '\0');
  }
  return;
}

Assistant:

void plot_masked_sprite_24px(tgestate_t *state, vischar_t *vischar)
{
  uint8_t        x;           /* was A */
  uint8_t        iters;       /* was B */
  const uint8_t *maskptr;     /* was HL' */
  const uint8_t *bitmapptr;   /* was HL */
  const uint8_t *foremaskptr; /* was HL */
  uint8_t       *screenptr;   /* was HL */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  if ((x = (vischar->isopos.x & 7)) < 4)
  {
    /* Shift right */

    x = ~x & 3; /* jump table offset (on input, x is 0..3) */

    maskptr   = state->mask_pointer;
    bitmapptr = state->bitmap_pointer;

    assert(maskptr   != NULL);
    assert(bitmapptr != NULL);

    iters = state->spriteplotter.height_24_right;
    assert(iters <= MASK_BUFFER_HEIGHT * 8);
    do
    {
      uint8_t bm0, bm1, bm2, bm3;         /* was B, C, E, D */
      uint8_t mask0, mask1, mask2, mask3; /* was B', C', E', D' */
      int     carry = 0;                  /* was flags */

      /* Load bitmap bytes into B,C,E. */
      bm0 = *bitmapptr++;
      bm1 = *bitmapptr++;
      bm2 = *bitmapptr++;

      /* Load mask bytes into B',C',E'. */
      mask0 = *maskptr++;
      mask1 = *maskptr++;
      mask2 = *maskptr++;

      if (state->sprite_index & sprite_FLAG_FLIP)
        flip_24_masked_pixels(state, &mask2, &mask1, &mask0, &bm2, &bm1, &bm0);

      foremaskptr = state->foreground_mask_pointer;
      screenptr   = state->window_buf_pointer; /* Conv: Moved compared to the other routines. */

      ASSERT_MASK_BUF_PTR_VALID(foremaskptr);
      ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 3);

      /* Shift bitmap */

      bm3 = 0;
      /* Conv: Replaced self-modified goto with if-else chain. */
      if (x <= 0)
      {
        SRL(bm0);
        RR(bm1);
        RR(bm2);
        RR(bm3);
      }
      if (x <= 1)
      {
        SRL(bm0);
        RR(bm1);
        RR(bm2);
        RR(bm3);
      }
      if (x <= 2)
      {
        SRL(bm0);
        RR(bm1);
        RR(bm2);
        RR(bm3);
      }

      /* Shift mask */

      mask3 = 0xFF;
      carry = 1;
      /* Conv: Replaced self-modified goto with if-else chain. */
      if (x <= 0)
      {
        RR(mask0);
        RR(mask1);
        RR(mask2);
        RR(mask3);
      }
      if (x <= 1)
      {
        RR(mask0);
        RR(mask1);
        RR(mask2);
        RR(mask3);
      }
      if (x <= 2)
      {
        RR(mask0);
        RR(mask1);
        RR(mask2);
        RR(mask3);
      }

      /* Plot, using foreground mask. */

      /* Conv: We form 'mask' inside of the enable_* condition. The original
       * game got away with accessing out-of-bounds memory but we can't. */

      if (state->spriteplotter.enable_24_right_1)
        *screenptr = MASK(bm0, mask0);
      foremaskptr++;
      screenptr++;

      if (state->spriteplotter.enable_24_right_2)
        *screenptr = MASK(bm1, mask1);
      foremaskptr++;
      screenptr++;

      if (state->spriteplotter.enable_24_right_3)
        *screenptr = MASK(bm2, mask2);
      foremaskptr++;
      screenptr++;

      if (state->spriteplotter.enable_24_right_4)
        *screenptr = MASK(bm3, mask3);
      foremaskptr++;
      state->foreground_mask_pointer = foremaskptr;

      screenptr += state->columns - 3; /* was 21 */
      if (iters > 1)
        ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 3);
      state->window_buf_pointer = screenptr;
    }
    while (--iters);
  }
  else
  {
    /* Shift left */

    x -= 4; /* jump table offset (on input, x is 4..7) */

    maskptr   = state->mask_pointer;
    bitmapptr = state->bitmap_pointer;

    assert(maskptr   != NULL);
    assert(bitmapptr != NULL);

    iters = state->spriteplotter.height_24_left;
    assert(iters <= MASK_BUFFER_HEIGHT * 8);
    do
    {
      /* Note the different variable order to the case above. */
      uint8_t bm0, bm1, bm2, bm3;         /* was E, C, B, D */
      uint8_t mask0, mask1, mask2, mask3; /* was E', C', B', D' */
      int     carry = 0;

      /* Load bitmap bytes into B,C,E. */
      bm2 = *bitmapptr++;
      bm1 = *bitmapptr++;
      bm0 = *bitmapptr++;

      /* Load mask bytes into B',C',E'. */
      mask2 = *maskptr++;
      mask1 = *maskptr++;
      mask0 = *maskptr++;

      if (state->sprite_index & sprite_FLAG_FLIP)
        flip_24_masked_pixels(state, &mask0, &mask1, &mask2, &bm0, &bm1, &bm2);

      foremaskptr = state->foreground_mask_pointer;
      screenptr   = state->window_buf_pointer;

      ASSERT_MASK_BUF_PTR_VALID(foremaskptr);
      ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 3);

      /* Shift bitmap bytes */

      bm3 = 0;
      /* Conv: Replaced self-modified goto with if-else chain. */
      if (x <= 0)
      {
        SLA(bm0);
        RL(bm1);
        RL(bm2);
        RL(bm3);
      }
      if (x <= 1)
      {
        SLA(bm0);
        RL(bm1);
        RL(bm2);
        RL(bm3);
      }
      if (x <= 2)
      {
        SLA(bm0);
        RL(bm1);
        RL(bm2);
        RL(bm3);
      }
      if (x <= 3)
      {
        SLA(bm0);
        RL(bm1);
        RL(bm2);
        RL(bm3);
      }

      /* Shift mask bytes */

      mask3 = 0xFF; /* all bits set => mask off */
      carry = 1; /* mask off */
      /* Conv: Replaced self-modified goto with if-else chain. */
      if (x <= 0)
      {
        RL(mask0);
        RL(mask1);
        RL(mask2);
        RL(mask3);
      }
      if (x <= 1)
      {
        RL(mask0);
        RL(mask1);
        RL(mask2);
        RL(mask3);
      }
      if (x <= 2)
      {
        RL(mask0);
        RL(mask1);
        RL(mask2);
        RL(mask3);
      }
      if (x <= 3)
      {
        RL(mask0);
        RL(mask1);
        RL(mask2);
        RL(mask3);
      }

      /* Plot, using foreground mask. */

      /* Conv: We form 'mask' inside of the enable_* condition. The original
       * game got away with accessing out-of-bounds memory but we can't. */

      if (state->spriteplotter.enable_24_left_1)
        *screenptr = MASK(bm3, mask3);
      foremaskptr++;
      screenptr++;

      if (state->spriteplotter.enable_24_left_2)
        *screenptr = MASK(bm2, mask2);
      foremaskptr++;
      screenptr++;

      if (state->spriteplotter.enable_24_left_3)
        *screenptr = MASK(bm1, mask1);
      foremaskptr++;
      screenptr++;

      if (state->spriteplotter.enable_24_left_4)
        *screenptr = MASK(bm0, mask0);
      foremaskptr++;
      state->foreground_mask_pointer = foremaskptr;

      screenptr += state->columns - 3; /* was 21 */
      if (iters > 1)
        ASSERT_WINDOW_BUF_PTR_VALID(screenptr, 3);
      state->window_buf_pointer = screenptr;
    }
    while (--iters);
  }
}